

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O2

void __thiscall
snmalloc::CombiningLockNode::attach_slow(CombiningLockNode *this,CombiningLock *lock)

{
  __int_type _Var1;
  __pointer_type pCVar2;
  bool bVar3;
  
  LOCK();
  pCVar2 = (lock->last)._M_b._M_p;
  (lock->last)._M_b._M_p = this;
  UNLOCK();
  if (pCVar2 == (__pointer_type)0x0) {
    while( true ) {
      LOCK();
      _Var1 = (lock->flag)._M_base._M_i;
      (lock->flag)._M_base._M_i = true;
      UNLOCK();
      if ((_Var1 & 1U) == 0) break;
      do {
      } while (((lock->flag)._M_base._M_i & 1U) != 0);
    }
  }
  else {
    (pCVar2->next)._M_b._M_p = this;
    wait<snmalloc::PALLinux>(this);
    if ((this->status)._M_i == DONE) {
      return;
    }
  }
  while( true ) {
    (*this->f_raw)(this);
    pCVar2 = (this->next)._M_b._M_p;
    if (pCVar2 == (__pointer_type)0x0) break;
    wake<snmalloc::PALLinux>(this,DONE);
    this = pCVar2;
  }
  LOCK();
  bVar3 = this == (lock->last)._M_b._M_p;
  if (bVar3) {
    (lock->last)._M_b._M_p = (__pointer_type)0x0;
  }
  UNLOCK();
  if (bVar3) {
    wake<snmalloc::PALLinux>(this,DONE);
    (lock->flag)._M_base._M_i = false;
    return;
  }
  do {
  } while ((this->next)._M_b._M_p == (__pointer_type)0x0);
  wake<snmalloc::PALLinux>((this->next)._M_b._M_p,HEAD);
  wake<snmalloc::PALLinux>(this,DONE);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void attach_slow(CombiningLock& lock)
    {
      // There is contention for the lock, we need to add our work to the
      // queue of pending work
      auto prev = lock.last.exchange(this, stl::memory_order_acq_rel);

      if (prev != nullptr)
      {
        // If we aren't the head, link into predecessor
        prev->next.store(this, stl::memory_order_release);

        // Wait to for predecessor to complete
        wait();

        // Determine if another thread completed our work.
        if (status.load(stl::memory_order_acquire) == LockStatus::DONE)
          return;
      }
      else
      {
        // We are the head of the queue. Spin until we acquire the fast path
        // lock.  As we are in the queue future requests shouldn't try to
        // acquire the fast path lock, but stale views of the queue being empty
        // could still be concurrent with this thread.
        while (lock.flag.exchange(true, stl::memory_order_acquire))
        {
          while (lock.flag.load(stl::memory_order_relaxed))
          {
            Aal::pause();
          }
        }

        // We could set
        //    status = LockStatus::HEAD
        // However, the subsequent state assumes it is HEAD, and
        // nothing would read it.
      }

      // We are the head of the queue, and responsible for
      // waking/performing our and subsequent work.
      auto curr = this;
      while (true)
      {
        // Start pulling in the next element of the queue
        auto n = curr->next.load(stl::memory_order_acquire);
        Aal::prefetch(n);

        // Perform work for head of the queue
        curr->f_raw(curr);

        // Determine if there are more elements.
        n = curr->next.load(stl::memory_order_acquire);
        if (n == nullptr)
          break;
        // Signal this work was completed and move on to
        // next item.
        wake(curr, LockStatus::DONE);
        curr = n;
      }

      // This could be the end of the queue, attempt to close the
      // queue.
      auto curr_c = curr;
      if (lock.last.compare_exchange_strong(
            curr_c,
            nullptr,
            stl::memory_order_release,
            stl::memory_order_relaxed))
      {
        // Queue was successfully closed.
        // Notify last element the work was completed.
        wake(curr, LockStatus::DONE);
        lock.release();
        return;
      }

      // Failed to close the queue wait for next thread to be
      // added.
      while (curr->next.load(stl::memory_order_relaxed) == nullptr)
        Aal::pause();

      auto n = curr->next.load(stl::memory_order_acquire);

      // As we had to wait, give the job to the next thread
      // to carry on performing the work.
      wake(n, LockStatus::HEAD);

      // Notify the thread that we completed its work.
      // Note that this needs to be before setting curr->status,
      // as after the status is set the thread may deallocate the
      // queue node.
      wake(curr, LockStatus::DONE);
      return;
    }